

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
EncodeConnectivityFromCorner
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          CornerIndex corner_id)

{
  pointer *ppIVar1;
  int *piVar2;
  int32_t *piVar3;
  ulong *puVar4;
  EdgebreakerTopologyBitPattern EVar5;
  mapped_type mVar6;
  _Bit_type *p_Var7;
  pointer pIVar8;
  iterator iVar9;
  bool bVar10;
  bool bVar11;
  pointer piVar12;
  CornerTable *pCVar13;
  mapped_type *pmVar14;
  int iVar15;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *pIVar16;
  uint uVar17;
  int neighbor_face_id;
  uint uVar18;
  iterator iVar19;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *pIVar20;
  ulong uVar21;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar22;
  EdgebreakerTopologyBitPattern EVar23;
  ulong uVar24;
  int iVar25;
  CornerIndex right_corner_id;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_78;
  EdgebreakerTopologyBitPattern local_74;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_70;
  int local_6c;
  vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
  *local_68;
  int local_5c;
  ulong local_58;
  MeshEdgebreakerTraversalPredictiveEncoder *local_50;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_48;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_38;
  
  pIVar16 = (this->corner_traversal_stack_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar19._M_current =
       (this->corner_traversal_stack_).
       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar19._M_current != pIVar16) {
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar16;
    iVar19._M_current = pIVar16;
  }
  local_48 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              *)&this->corner_traversal_stack_;
  if (iVar19._M_current ==
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_78.value_ = corner_id.value_;
    std::
    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
    ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
              (local_48,iVar19,&local_78);
    pIVar16 = (this->corner_traversal_stack_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar20 = (this->corner_traversal_stack_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar19._M_current)->value_ = corner_id.value_;
    pIVar20 = iVar19._M_current + 1;
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar20;
  }
  if (pIVar16 != pIVar20) {
    local_5c = (int)((ulong)((long)(this->mesh_->faces_).vector_.
                                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->mesh_->faces_).vector_.
                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    local_38 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                *)&this->processed_connectivity_corners_;
    local_50 = &this->traversal_encoder_;
    local_68 = (vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                *)&(this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_;
    local_40 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->face_to_split_symbol_map_;
    do {
      IVar22.value_ = pIVar20[-1].value_;
      if ((IVar22.value_ == 0xffffffff) ||
         ((*(ulong *)((long)(this->visited_faces_).super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     + (ulong)(IVar22.value_ / 0x18 & 0xfffffff8)) >>
           ((ulong)IVar22.value_ / 3 & 0x3f) & 1) != 0)) {
        pIVar20 = pIVar20 + -1;
LAB_0013c83e:
        (this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pIVar20;
      }
      else {
        iVar25 = local_5c;
        if (0 < local_5c) {
          do {
            this->last_encoded_symbol_id_ = this->last_encoded_symbol_id_ + 1;
            uVar24 = (ulong)IVar22.value_ / 3;
            if (IVar22.value_ == 0xffffffff) {
              uVar24 = 0xffffffff;
            }
            EVar23 = (EdgebreakerTopologyBitPattern)uVar24;
            puVar4 = (this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar24 >> 6)
            ;
            *puVar4 = *puVar4 | 1L << ((byte)uVar24 & 0x3f);
            iVar19._M_current =
                 (this->processed_connectivity_corners_).
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_78.value_ = IVar22.value_;
            if (iVar19._M_current ==
                (this->processed_connectivity_corners_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                        (local_38,iVar19,&local_78);
            }
            else {
              (iVar19._M_current)->value_ = IVar22.value_;
              (this->processed_connectivity_corners_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar19._M_current + 1;
            }
            (this->traversal_encoder_).last_corner_.value_ = local_78.value_;
            pCVar13 = (this->corner_table_)._M_t.
                      super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                      .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
            if ((ulong)local_78.value_ == 0xffffffff) {
              uVar24 = 0xffffffff;
            }
            else {
              uVar24 = (ulong)*(uint *)(*(long *)&(pCVar13->corner_to_vertex_map_).vector_ +
                                       (ulong)local_78.value_ * 4);
            }
            p_Var7 = (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            iVar15 = (this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar24];
            uVar21 = p_Var7[uVar24 >> 6];
            if (((uVar21 >> (uVar24 & 0x3f) & 1) == 0) &&
               (p_Var7[uVar24 >> 6] = uVar21 | 1L << (uVar24 & 0x3f), iVar15 == -1)) {
              MeshEdgebreakerTraversalPredictiveEncoder::EncodeSymbol(local_50,TOPOLOGY_C);
              IVar22.value_ = 0xffffffff;
              if (local_78.value_ != 0xffffffff) {
                uVar17 = local_78.value_ - 2;
                if (0x55555555 < (local_78.value_ + 1) * -0x55555555) {
                  uVar17 = local_78.value_ + 1;
                }
                if (uVar17 != 0xffffffff) {
                  IVar22.value_ =
                       *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                             .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                            _M_head_impl)->opposite_corners_).vector_.
                                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                + (ulong)uVar17 * 4);
                }
              }
            }
            else {
              if (local_78.value_ == 0xffffffff) {
                local_70.value_ = 0xffffffff;
LAB_0013c94c:
                bVar11 = IsRightFaceVisited(this,(CornerIndex)local_78.value_);
                bVar10 = IsLeftFaceVisited(this,(CornerIndex)local_78.value_);
                if (!bVar11) {
                  if (!bVar10) {
                    IVar22.value_ = 0xffffffff;
                    local_6c = iVar15;
                    local_58 = uVar24;
                    goto LAB_0013cc89;
                  }
                  goto LAB_0013ca6b;
                }
                IVar22.value_ = 0xffffffff;
                if (!bVar10) goto LAB_0013ca1e;
LAB_0013cbed:
                piVar2 = &(this->traversal_encoder_).num_symbols_;
                *piVar2 = *piVar2 + 1;
                uVar17 = (this->traversal_encoder_).last_corner_.value_;
                if ((ulong)uVar17 == 0xffffffff) {
                  piVar12 = (this->traversal_encoder_).vertex_valences_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar12[0xffffffff] = piVar12[0xffffffff] + -4;
LAB_0013cd41:
                  uVar24 = 0xffffffff;
                }
                else {
                  uVar18 = uVar17 - 2;
                  if (0x55555555 < uVar17 * -0x55555555 + 0xaaaaaaab) {
                    uVar18 = uVar17 + 1;
                  }
                  piVar12 = (this->traversal_encoder_).vertex_valences_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pIVar8 = (((this->traversal_encoder_).corner_table_)->corner_to_vertex_map_).
                           vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  piVar12[pIVar8[uVar17].value_] = piVar12[pIVar8[uVar17].value_] + -2;
                  uVar24 = 0xffffffff;
                  if (uVar18 != 0xffffffff) {
                    uVar24 = (ulong)pIVar8[uVar18].value_;
                  }
                  uVar17 = ((uVar17 * -0x55555555 < 0x55555556) - 1 | 2) + uVar17;
                  piVar12[uVar24] = piVar12[uVar24] + -2;
                  if (uVar17 == 0xffffffff) goto LAB_0013cd41;
                  uVar24 = (ulong)pIVar8[uVar17].value_;
                }
                piVar12[uVar24] = piVar12[uVar24] + -2;
                EVar23 = (this->traversal_encoder_).prev_symbol_;
                if (EVar23 != ~TOPOLOGY_C) {
                  iVar9._M_current =
                       (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                       super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_74 = EVar23;
                  if (iVar9._M_current ==
                      (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                      super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                    ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                              (local_68,iVar9,&local_74);
                  }
                  else {
                    *iVar9._M_current = EVar23;
                    (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                    super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
                  }
                }
                (this->traversal_encoder_).prev_symbol_ = 7;
                ppIVar1 = &(this->corner_traversal_stack_).
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppIVar1 = *ppIVar1 + -1;
                break;
              }
              uVar17 = local_78.value_ - 2;
              if (0x55555555 < (local_78.value_ + 1) * -0x55555555) {
                uVar17 = local_78.value_ + 1;
              }
              if (uVar17 == 0xffffffff) {
                uVar21 = 0xffffffff;
              }
              else {
                uVar21 = (ulong)*(uint *)(*(long *)&(pCVar13->opposite_corners_).vector_.
                                                                                                        
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                         + (ulong)uVar17 * 4);
              }
              local_70.value_ = (uint)uVar21;
              if (local_78.value_ * -0x55555555 < 0x55555556) {
                uVar17 = local_78.value_ + 2;
                if (uVar17 != 0xffffffff) goto LAB_0013c9b1;
                local_6c = iVar15;
                local_58 = uVar24;
                if (local_70.value_ == 0xffffffff) goto LAB_0013c94c;
                neighbor_face_id = (int)(uVar21 / 3);
                IVar22.value_ = 0xffffffff;
                uVar17 = 0xffffffff;
              }
              else {
                uVar17 = local_78.value_ - 1;
LAB_0013c9b1:
                IVar22.value_ =
                     *(uint *)(*(long *)&(pCVar13->opposite_corners_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                              + (ulong)uVar17 * 4);
                neighbor_face_id = (int)(uVar21 / 3);
                if (local_70.value_ == 0xffffffff) {
                  neighbor_face_id = -1;
                }
                uVar17 = IVar22.value_ / 3;
                if (IVar22.value_ == 0xffffffff) {
                  uVar17 = 0xffffffff;
                }
              }
              local_6c = iVar15;
              local_58 = uVar24;
              bVar11 = IsRightFaceVisited(this,(CornerIndex)local_78.value_);
              if (bVar11) {
                if (neighbor_face_id != -1) {
                  CheckAndStoreTopologySplitEvent
                            (this,this->last_encoded_symbol_id_,EVar23,RIGHT_FACE_EDGE,
                             neighbor_face_id);
                }
                bVar11 = IsLeftFaceVisited(this,(CornerIndex)local_78.value_);
                if (bVar11) {
                  if (uVar17 != 0xffffffff) {
                    CheckAndStoreTopologySplitEvent
                              (this,this->last_encoded_symbol_id_,EVar23,LEFT_FACE_EDGE,uVar17);
                  }
                  goto LAB_0013cbed;
                }
LAB_0013ca1e:
                MeshEdgebreakerTraversalPredictiveEncoder::EncodeSymbol(local_50,TOPOLOGY_R);
                goto LAB_0013cb98;
              }
              bVar11 = IsLeftFaceVisited(this,(CornerIndex)local_78.value_);
              if (!bVar11) {
LAB_0013cc89:
                iVar25 = local_6c;
                piVar2 = &(this->traversal_encoder_).num_symbols_;
                *piVar2 = *piVar2 + 1;
                uVar17 = (this->traversal_encoder_).last_corner_.value_;
                if (uVar17 == 0xffffffff) {
                  pCVar13 = (this->traversal_encoder_).corner_table_;
                  piVar12 = (this->traversal_encoder_).vertex_valences_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar12[0xffffffff] = piVar12[0xffffffff] + -1;
                  uVar24 = 0xffffffff;
                }
                else {
                  uVar18 = uVar17 - 2;
                  if (0x55555555 < uVar17 * -0x55555555 + 0xaaaaaaab) {
                    uVar18 = uVar17 + 1;
                  }
                  pCVar13 = (this->traversal_encoder_).corner_table_;
                  uVar24 = 0xffffffff;
                  if (uVar18 != 0xffffffff) {
                    uVar24 = (ulong)(pCVar13->corner_to_vertex_map_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar18].value_;
                  }
                  uVar17 = ((uVar17 * -0x55555555 < 0x55555556) - 1 | 2) + uVar17;
                  piVar12 = (this->traversal_encoder_).vertex_valences_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar12[uVar24] = piVar12[uVar24] + -1;
                  if (uVar17 == 0xffffffff) {
                    uVar24 = 0xffffffff;
                  }
                  else {
                    uVar24 = (ulong)(pCVar13->corner_to_vertex_map_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar17].value_;
                  }
                }
                piVar12[uVar24] = piVar12[uVar24] + -1;
                uVar24 = (ulong)(this->traversal_encoder_).last_corner_.value_;
                uVar21 = 0xffffffff;
                if (uVar24 != 0xffffffff) {
                  uVar21 = (ulong)(pCVar13->corner_to_vertex_map_).vector_.
                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar24].value_;
                }
                piVar12[uVar21] = -1;
                piVar3 = &(this->traversal_encoder_).num_split_symbols_;
                *piVar3 = *piVar3 + 1;
                EVar5 = (this->traversal_encoder_).prev_symbol_;
                if (EVar5 != ~TOPOLOGY_C) {
                  iVar9._M_current =
                       (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                       super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_74 = EVar5;
                  if (iVar9._M_current ==
                      (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                      super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                    ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                              (local_68,iVar9,&local_74);
                  }
                  else {
                    *iVar9._M_current = EVar5;
                    (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                    super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
                  }
                }
                this->num_split_symbols_ = this->num_split_symbols_ + 1;
                (this->traversal_encoder_).prev_symbol_ = 1;
                if (iVar25 != -1) {
                  iVar25 = (this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[local_58];
                  uVar24 = (ulong)iVar25;
                  iVar15 = iVar25 + 0x3f;
                  if (-1 < (long)uVar24) {
                    iVar15 = iVar25;
                  }
                  if (((this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [(long)(iVar15 >> 6) +
                        (ulong)((uVar24 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff] >> (uVar24 & 0x3f) & 1) == 0) {
                    EncodeHole(this,(CornerIndex)local_78.value_,false);
                  }
                }
                mVar6 = this->last_encoded_symbol_id_;
                local_74 = EVar23;
                pmVar14 = std::__detail::
                          _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[](local_40,(key_type *)&local_74);
                *pmVar14 = mVar6;
                iVar19._M_current =
                     (this->corner_traversal_stack_).
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                iVar19._M_current[-1].value_ = IVar22.value_;
                if (iVar19._M_current !=
                    (this->corner_traversal_stack_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  (iVar19._M_current)->value_ = local_70.value_;
                  pIVar20 = iVar19._M_current + 1;
                  goto LAB_0013c83e;
                }
                std::
                vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                ::
                _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                          (local_48,iVar19,&local_70);
                break;
              }
              if (uVar17 != 0xffffffff) {
                CheckAndStoreTopologySplitEvent
                          (this,this->last_encoded_symbol_id_,EVar23,LEFT_FACE_EDGE,uVar17);
              }
LAB_0013ca6b:
              piVar2 = &(this->traversal_encoder_).num_symbols_;
              *piVar2 = *piVar2 + 1;
              uVar17 = (this->traversal_encoder_).last_corner_.value_;
              if ((ulong)uVar17 == 0xffffffff) {
                piVar12 = (this->traversal_encoder_).vertex_valences_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar12[0xffffffff] = piVar12[0xffffffff] + -3;
LAB_0013cb00:
                uVar24 = 0xffffffff;
              }
              else {
                uVar18 = uVar17 - 2;
                if (0x55555555 < uVar17 * -0x55555555 + 0xaaaaaaab) {
                  uVar18 = uVar17 + 1;
                }
                piVar12 = (this->traversal_encoder_).vertex_valences_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pIVar8 = (((this->traversal_encoder_).corner_table_)->corner_to_vertex_map_).vector_
                         .
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                piVar12[pIVar8[uVar17].value_] = piVar12[pIVar8[uVar17].value_] + -1;
                uVar24 = 0xffffffff;
                if (uVar18 != 0xffffffff) {
                  uVar24 = (ulong)pIVar8[uVar18].value_;
                }
                uVar17 = ((uVar17 * -0x55555555 < 0x55555556) - 1 | 2) + uVar17;
                piVar12[uVar24] = piVar12[uVar24] + -2;
                if (uVar17 == 0xffffffff) goto LAB_0013cb00;
                uVar24 = (ulong)pIVar8[uVar17].value_;
              }
              piVar12[uVar24] = piVar12[uVar24] + -1;
              EVar23 = (this->traversal_encoder_).prev_symbol_;
              if (EVar23 != ~TOPOLOGY_C) {
                iVar9._M_current =
                     (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                     super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_74 = EVar23;
                if (iVar9._M_current ==
                    (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                    super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                  ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                            (local_68,iVar9,&local_74);
                }
                else {
                  *iVar9._M_current = EVar23;
                  (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                  super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
                }
              }
              (this->traversal_encoder_).prev_symbol_ = 3;
              IVar22.value_ = local_70.value_;
            }
LAB_0013cb98:
            iVar25 = iVar25 + -1;
          } while (iVar25 != 0);
        }
      }
      pIVar20 = (this->corner_traversal_stack_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != pIVar20);
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeConnectivityFromCorner(
    CornerIndex corner_id) {
  corner_traversal_stack_.clear();
  corner_traversal_stack_.push_back(corner_id);
  const int num_faces = mesh_->num_faces();
  while (!corner_traversal_stack_.empty()) {
    // Currently processed corner.
    corner_id = corner_traversal_stack_.back();
    // Make sure the face hasn't been visited yet.
    if (corner_id == kInvalidCornerIndex ||
        visited_faces_[corner_table_->Face(corner_id).value()]) {
      // This face has been already traversed.
      corner_traversal_stack_.pop_back();
      continue;
    }
    int num_visited_faces = 0;
    while (num_visited_faces < num_faces) {
      // Mark the current face as visited.
      ++num_visited_faces;
      ++last_encoded_symbol_id_;

      const FaceIndex face_id = corner_table_->Face(corner_id);
      visited_faces_[face_id.value()] = true;
      processed_connectivity_corners_.push_back(corner_id);
      traversal_encoder_.NewCornerReached(corner_id);
      const VertexIndex vert_id = corner_table_->Vertex(corner_id);
      const bool on_boundary = (vertex_hole_id_[vert_id.value()] != -1);
      if (!IsVertexVisited(vert_id)) {
        // A new unvisited vertex has been reached. We need to store its
        // position difference using next, prev, and opposite vertices.
        visited_vertex_ids_[vert_id.value()] = true;
        if (!on_boundary) {
          // If the vertex is on boundary it must correspond to an unvisited
          // hole and it will be encoded with TOPOLOGY_S symbol later).
          traversal_encoder_.EncodeSymbol(TOPOLOGY_C);
          // Move to the right triangle.
          corner_id = GetRightCorner(corner_id);
          continue;
        }
      }
      // The current vertex has been already visited or it was on a boundary.
      // We need to determine whether we can visit any of it's neighboring
      // faces.
      const CornerIndex right_corner_id = GetRightCorner(corner_id);
      const CornerIndex left_corner_id = GetLeftCorner(corner_id);
      const FaceIndex right_face_id = corner_table_->Face(right_corner_id);
      const FaceIndex left_face_id = corner_table_->Face(left_corner_id);
      if (IsRightFaceVisited(corner_id)) {
        // Right face has been already visited.
        // Check whether there is a topology split event.
        if (right_face_id != kInvalidFaceIndex) {
          CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                          face_id.value(), RIGHT_FACE_EDGE,
                                          right_face_id.value());
        }
        if (IsLeftFaceVisited(corner_id)) {
          // Both neighboring faces are visited. End reached.
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_E);
          corner_traversal_stack_.pop_back();
          break;  // Break from the while (num_visited_faces < num_faces) loop.
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_R);
          // Go to the left face.
          corner_id = left_corner_id;
        }
      } else {
        // Right face was not visited.
        if (IsLeftFaceVisited(corner_id)) {
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_L);
          // Left face visited, go to the right one.
          corner_id = right_corner_id;
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_S);
          ++num_split_symbols_;
          // Both neighboring faces are unvisited, we need to visit both of
          // them.
          if (on_boundary) {
            // The tip vertex is on a hole boundary. If the hole hasn't been
            // visited yet we need to encode it.
            const int hole_id = vertex_hole_id_[vert_id.value()];
            if (!visited_holes_[hole_id]) {
              EncodeHole(corner_id, false);
            }
          }
          face_to_split_symbol_map_[face_id.value()] = last_encoded_symbol_id_;
          // Split the traversal.
          // First make the top of the current corner stack point to the left
          // face (this one will be processed second).
          corner_traversal_stack_.back() = left_corner_id;
          // Add a new corner to the top of the stack (right face needs to
          // be traversed first).
          corner_traversal_stack_.push_back(right_corner_id);
          // Break from the while (num_visited_faces < num_faces) loop.
          break;
        }
      }
    }
  }
  return true;  // All corners have been processed.
}